

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# start_vacuum.cpp
# Opt level: O0

void pstore::start_vacuum(database *db)

{
  czstring path;
  UI_STRING *uis;
  UI *ui;
  undefined1 local_140 [32];
  function<void_()> local_120;
  undefined1 local_100 [8];
  writer wr;
  update_callback local_b0;
  undefined1 local_90 [8];
  fifo_path fifo;
  database *db_local;
  
  fifo.update_cb_._M_invoker = (_Invoker_type)db;
  std::function<void(pstore::brokerface::fifo_path::operation)>::
  function<void(&)(pstore::brokerface::fifo_path::operation),void>
            ((function<void(pstore::brokerface::fifo_path::operation)> *)&local_b0,
             brokerface::fifo_path::default_update_cb);
  brokerface::fifo_path::fifo_path((fifo_path *)local_90,(czstring)0x0,&local_b0);
  std::function<void_(pstore::brokerface::fifo_path::operation)>::~function(&local_b0);
  std::function<void()>::function<void(&)(),void>
            ((function<void()> *)(local_140 + 0x20),brokerface::writer::default_callback);
  brokerface::writer::writer((writer *)local_100,(UI *)local_90,(UI_STRING *)(local_140 + 0x20));
  std::function<void_()>::~function((function<void_()> *)(local_140 + 0x20));
  database::path_abi_cxx11_((database *)local_140);
  path = (czstring)std::__cxx11::string::c_str();
  ui = (UI *)0x0;
  brokerface::send_message((writer *)local_100,false,"GC",path);
  std::__cxx11::string::~string((string *)local_140);
  brokerface::writer::~writer((writer *)local_100,ui,uis);
  brokerface::fifo_path::~fifo_path((fifo_path *)local_90);
  return;
}

Assistant:

void start_vacuum (database const & db) {
        brokerface::fifo_path const fifo (nullptr);
        brokerface::writer wr (fifo);
        brokerface::send_message (wr, false /*error on timeout*/, "GC", db.path ().c_str ());
    }